

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O0

int Cudd_bddApproxConjDecomp(DdManager *dd,DdNode *f,DdNode ***conjuncts)

{
  int numVars;
  DdNode *pDVar1;
  DdNode *c;
  DdNode *n;
  DdNode **ppDVar2;
  int nvars;
  DdNode *hlocal;
  DdNode *glocal;
  DdNode *superset2;
  DdNode *superset1;
  DdNode ***conjuncts_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  numVars = Cudd_SupportSize(dd,f);
  pDVar1 = Cudd_RemapOverApprox(dd,f,numVars,0,1.0);
  if (pDVar1 == (DdNode *)0x0) {
    dd_local._4_4_ = 0;
  }
  else {
    *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
    c = Cudd_bddSqueeze(dd,f,pDVar1);
    if (c == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar1);
      dd_local._4_4_ = 0;
    }
    else {
      *(int *)(((ulong)c & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)c & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref(dd,pDVar1);
      pDVar1 = Cudd_bddLICompaction(dd,f,c);
      if (pDVar1 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,c);
        dd_local._4_4_ = 0;
      }
      else {
        *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
        n = Cudd_bddLICompaction(dd,c,pDVar1);
        if (n == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,c);
          Cudd_RecursiveDeref(dd,pDVar1);
          dd_local._4_4_ = 0;
        }
        else {
          *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,c);
          if (n == dd->one) {
            Cudd_RecursiveDeref(dd,n);
            ppDVar2 = (DdNode **)malloc(8);
            *conjuncts = ppDVar2;
            if (*conjuncts == (DdNode **)0x0) {
              Cudd_RecursiveDeref(dd,pDVar1);
              dd->errorCode = CUDD_MEMORY_OUT;
              dd_local._4_4_ = 0;
            }
            else {
              **conjuncts = pDVar1;
              dd_local._4_4_ = 1;
            }
          }
          else if (pDVar1 == dd->one) {
            Cudd_RecursiveDeref(dd,pDVar1);
            ppDVar2 = (DdNode **)malloc(8);
            *conjuncts = ppDVar2;
            if (*conjuncts == (DdNode **)0x0) {
              Cudd_RecursiveDeref(dd,n);
              dd->errorCode = CUDD_MEMORY_OUT;
              dd_local._4_4_ = 0;
            }
            else {
              **conjuncts = n;
              dd_local._4_4_ = 1;
            }
          }
          else {
            ppDVar2 = (DdNode **)malloc(0x10);
            *conjuncts = ppDVar2;
            if (*conjuncts == (DdNode **)0x0) {
              Cudd_RecursiveDeref(dd,n);
              Cudd_RecursiveDeref(dd,pDVar1);
              dd->errorCode = CUDD_MEMORY_OUT;
              dd_local._4_4_ = 0;
            }
            else {
              **conjuncts = n;
              (*conjuncts)[1] = pDVar1;
              dd_local._4_4_ = 2;
            }
          }
        }
      }
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_bddApproxConjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** conjuncts /* address of the first factor */)
{
    DdNode *superset1, *superset2, *glocal, *hlocal;
    int nvars = Cudd_SupportSize(dd,f);

    /* Find a tentative first factor by overapproximation and minimization. */
    superset1 = Cudd_RemapOverApprox(dd,f,nvars,0,1.0);
    if (superset1 == NULL) return(0);
    cuddRef(superset1);
    superset2 = Cudd_bddSqueeze(dd,f,superset1);
    if (superset2 == NULL) {
        Cudd_RecursiveDeref(dd,superset1);
        return(0);
    }
    cuddRef(superset2);
    Cudd_RecursiveDeref(dd,superset1);

    /* Compute the second factor by minimization. */
    hlocal = Cudd_bddLICompaction(dd,f,superset2);
    if (hlocal == NULL) {
        Cudd_RecursiveDeref(dd,superset2);
        return(0);
    }
    cuddRef(hlocal);

    /* Refine the first factor by minimization. If h turns out to be f, this
    ** step guarantees that g will be 1. */
    glocal = Cudd_bddLICompaction(dd,superset2,hlocal);
    if (glocal == NULL) {
        Cudd_RecursiveDeref(dd,superset2);
        Cudd_RecursiveDeref(dd,hlocal);
        return(0);
    }
    cuddRef(glocal);
    Cudd_RecursiveDeref(dd,superset2);

    if (glocal != DD_ONE(dd)) {
        if (hlocal != DD_ONE(dd)) {
            *conjuncts = ABC_ALLOC(DdNode *,2);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                Cudd_RecursiveDeref(dd,hlocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            (*conjuncts)[1] = hlocal;
            return(2);
        } else {
            Cudd_RecursiveDeref(dd,hlocal);
            *conjuncts = ABC_ALLOC(DdNode *,1);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            return(1);
        }
    } else {
        Cudd_RecursiveDeref(dd,glocal);
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            Cudd_RecursiveDeref(dd,hlocal);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = hlocal;
        return(1);
    }

}